

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O1

void calc_inventory(player *p)

{
  wchar_t *pwVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  wchar_t wVar5;
  int iVar6;
  _Bool _Var7;
  wchar_t wVar8;
  object **p_00;
  void *p_01;
  char *p_02;
  object *obj;
  object *poVar9;
  object *poVar10;
  object **ppoVar11;
  object **ppoVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  wchar_t amt;
  ulong uVar18;
  int iVar19;
  char *pcVar20;
  ulong uVar21;
  bool bVar22;
  uint local_60;
  
  wVar5 = p->upkeep->inven_cnt;
  uVar3 = z_info->pack_size;
  wVar8 = pack_slots_used(p);
  iVar19 = (uint)z_info->pack_size + (uint)z_info->quiver_size;
  uVar4 = (p->body).count;
  uVar17 = (uint)uVar4 + iVar19 + 1;
  p_00 = (object **)mem_zalloc((ulong)z_info->quiver_size << 3);
  p_01 = mem_zalloc((ulong)z_info->pack_size << 3);
  p_02 = (char *)mem_alloc((ulong)uVar17);
  uVar21 = (ulong)uVar17;
  uVar14 = 0;
  for (poVar10 = p->gear; poVar10 != (object *)0x0; poVar10 = poVar10->next) {
    if (uVar21 == uVar14) {
      __assert_fail("j < n_max",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                    ,0x46f,"void calc_inventory(struct player *)");
    }
    _Var7 = object_is_equipped(p->body,poVar10);
    p_02[uVar14] = _Var7;
    uVar14 = uVar14 + 1;
  }
  if ((uint)uVar14 < uVar17) {
    local_60 = (uint)uVar4;
    memset(p_02 + (uVar14 & 0xffffffff),0,(ulong)((iVar19 + local_60) - (uint)uVar14) + 1);
  }
  p->upkeep->quiver_cnt = L'\0';
  if (z_info->quiver_size != 0) {
    uVar14 = 0;
    ppoVar11 = p_00;
    do {
      poVar10 = p->upkeep->quiver[uVar14];
      ppoVar12 = ppoVar11;
      if (poVar10 != (object *)0x0) {
        *ppoVar11 = poVar10;
        ppoVar12 = p->upkeep->quiver + uVar14;
      }
      *ppoVar12 = (object *)0x0;
      uVar14 = uVar14 + 1;
      ppoVar11 = ppoVar11 + 1;
    } while (uVar14 < z_info->quiver_size);
  }
  iVar19 = (uint)uVar3 - wVar8;
  iVar13 = 0;
  pcVar20 = p_02;
  for (poVar10 = p->gear; poVar10 != (object *)0x0; poVar10 = poVar10->next) {
    if ((((*pcVar20 == '\0') && (wVar8 = preferred_quiver_slot(poVar10), L'\xffffffff' < wVar8)) &&
        (wVar8 < (int)(uint)z_info->quiver_size)) &&
       (p->upkeep->quiver[(uint)wVar8] == (object *)0x0)) {
      _Var7 = tval_is_ammo(poVar10);
      uVar17 = 1;
      if (!_Var7) {
        uVar17 = (uint)z_info->thrown_quiver_mult;
      }
      bVar2 = poVar10->number;
      uVar3 = z_info->quiver_slot_size;
      poVar9 = poVar10;
      if ((uint)uVar3 < uVar17 * bVar2) {
        amt = (uint)bVar2 - uVar3 / uVar17;
        if ((uint)bVar2 < uVar3 / uVar17 || amt == L'\0') {
          __assert_fail("nsplit < current->number",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                        ,0x49c,"void calc_inventory(struct player *)");
        }
        if ((uVar3 < uVar17) || (iVar19 < iVar13)) {
          poVar9 = (object *)0x0;
        }
        else {
          obj = object_split(poVar10,amt);
          gear_insert_end(p,obj);
          iVar13 = iVar13 + 1;
        }
      }
      if (poVar9 != (object *)0x0) {
        p->upkeep->quiver[(uint)wVar8] = poVar9;
        pwVar1 = &p->upkeep->quiver_cnt;
        *pwVar1 = *pwVar1 + uVar17 * poVar9->number;
        *pcVar20 = '\x01';
      }
    }
    pcVar20 = pcVar20 + 1;
  }
  if (z_info->quiver_size != 0) {
    uVar14 = 0;
    do {
      if (p->upkeep->quiver[uVar14] == (object *)0x0) {
        poVar10 = p->gear;
        if (poVar10 == (object *)0x0) {
          lVar16 = -1;
          poVar9 = (object *)0x0;
        }
        else {
          iVar6 = -1;
          uVar15 = 0;
          poVar9 = (object *)0x0;
          do {
            if (uVar21 == uVar15) {
              __assert_fail("j < n_max",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                            ,0x4c8,"void calc_inventory(struct player *)");
            }
            if ((p_02[uVar15] == '\0') && (_Var7 = tval_is_ammo(poVar10), _Var7)) {
              if ((((ushort)poVar10->number <= z_info->quiver_slot_size) ||
                  (z_info->quiver_slot_size != 0 && iVar13 <= iVar19)) &&
                 (_Var7 = earlier_object(poVar9,poVar10,false), _Var7)) {
                iVar6 = (int)uVar15;
                poVar9 = poVar10;
              }
            }
            uVar15 = uVar15 + 1;
            poVar10 = poVar10->next;
          } while (poVar10 != (object *)0x0);
          lVar16 = (long)iVar6;
        }
        if (poVar9 == (object *)0x0) break;
        uVar3 = z_info->quiver_slot_size;
        wVar8 = (uint)poVar9->number - (uint)uVar3;
        if ((uint)uVar3 <= (uint)poVar9->number && wVar8 != L'\0') {
          if ((uVar3 == 0) || (iVar19 < iVar13)) {
            __assert_fail("z_info->quiver_slot_size > 0 && n_stack_split <= n_pack_remaining",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                          ,0x4e6,"void calc_inventory(struct player *)");
          }
          poVar10 = object_split(poVar9,wVar8);
          gear_insert_end(p,poVar10);
        }
        p->upkeep->quiver[uVar14] = poVar9;
        pwVar1 = &p->upkeep->quiver_cnt;
        *pwVar1 = *pwVar1 + (uint)poVar9->number;
        p_02[lVar16] = '\x01';
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < z_info->quiver_size);
  }
  if ((character_dungeon == true) && ((ulong)z_info->quiver_size != 0)) {
    uVar14 = 0;
    do {
      if ((p_00[uVar14] != (object *)0x0) && (p->upkeep->quiver[uVar14] != p_00[uVar14])) {
        msg("You re-arrange your quiver.");
        break;
      }
      uVar14 = uVar14 + 1;
    } while (z_info->quiver_size != uVar14);
  }
  if (z_info->pack_size != 0) {
    uVar14 = 0;
    do {
      *(object **)((long)p_01 + uVar14 * 8) = p->upkeep->inven[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar14 < z_info->pack_size);
  }
  p->upkeep->inven_cnt = L'\0';
  uVar14 = 0;
  do {
    poVar10 = p->gear;
    if (poVar10 == (object *)0x0) {
      lVar16 = -1;
      poVar9 = (object *)0x0;
    }
    else {
      uVar15 = 0xffffffff;
      uVar18 = 0;
      poVar9 = (object *)0x0;
      do {
        if (uVar21 == uVar18) {
          __assert_fail("j < n_max",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                        ,0x50d,"void calc_inventory(struct player *)");
        }
        if ((p_02[uVar18] == '\0') && (_Var7 = earlier_object(poVar9,poVar10,false), _Var7)) {
          uVar15 = uVar18 & 0xffffffff;
          poVar9 = poVar10;
        }
        uVar18 = uVar18 + 1;
        poVar10 = poVar10->next;
      } while (poVar10 != (object *)0x0);
      lVar16 = (long)(int)uVar15;
    }
    p->upkeep->inven[uVar14] = poVar9;
    if (poVar9 != (object *)0x0) {
      pwVar1 = &p->upkeep->inven_cnt;
      *pwVar1 = *pwVar1 + L'\x01';
      p_02[lVar16] = '\x01';
    }
    bVar22 = uVar14 < z_info->pack_size;
    uVar14 = uVar14 + 1;
  } while (bVar22);
  if (((character_dungeon == true) && (p->upkeep->inven_cnt == wVar5)) && (z_info->pack_size != 0))
  {
    uVar14 = 0;
    do {
      poVar10 = *(object **)((long)p_01 + uVar14 * 8);
      if (((poVar10 != (object *)0x0) && (p->upkeep->inven[uVar14] != poVar10)) &&
         (_Var7 = object_is_equipped(p->body,poVar10), !_Var7)) {
        msg("You re-arrange your pack.");
        break;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < z_info->pack_size);
  }
  mem_free(p_02);
  mem_free(p_01);
  mem_free(p_00);
  return;
}

Assistant:

void calc_inventory(struct player *p)
{
	int old_inven_cnt = p->upkeep->inven_cnt;
	int n_stack_split = 0;
	int n_pack_remaining = z_info->pack_size - pack_slots_used(p);
	int n_max = 1 + z_info->pack_size + z_info->quiver_size
		+ p->body.count;
	struct object **old_quiver = mem_zalloc(z_info->quiver_size
		* sizeof(*old_quiver));
	struct object **old_pack = mem_zalloc(z_info->pack_size
		* sizeof(*old_pack));
	bool *assigned = mem_alloc(n_max * sizeof(*assigned));
	struct object *current;
	int i, j;

	/*
	 * Equipped items are already taken care of.  Only the others need
	 * to be tested for assignment to the quiver or pack.
	 */
	for (current = p->gear, j = 0; current; current = current->next, ++j) {
		assert(j < n_max);
		assigned[j] = object_is_equipped(p->body, current);
	}
	for (; j < n_max; ++j) {
		assigned[j] = false;
	}

	/* Prepare to fill the quiver */
	p->upkeep->quiver_cnt = 0;

	/* Copy the current quiver and then leave it empty. */
	for (i = 0; i < z_info->quiver_size; i++) {
		if (p->upkeep->quiver[i]) {
			old_quiver[i] = p->upkeep->quiver[i];
			p->upkeep->quiver[i] = NULL;
		} else {
			old_quiver[i] = NULL;
		}
	}

	/* Fill quiver.  First, allocate inscribed items. */
	for (current = p->gear, j = 0; current; current = current->next, ++j) {
		int prefslot;

		/* Skip already assigned (i.e. equipped) items. */
		if (assigned[j]) continue;

		prefslot  = preferred_quiver_slot(current);
		if (prefslot >= 0 && prefslot < z_info->quiver_size
				&& !p->upkeep->quiver[prefslot]) {
			/*
			 * The preferred slot is empty.  Split the stack if
			 * necessary.  Don't allow splitting if it could
			 * result in overfilling the pack by more than one slot.
			 */
			int mult = tval_is_ammo(current) ?
				1 : z_info->thrown_quiver_mult;
			struct object *to_quiver;

			if (current->number * mult
					<= z_info->quiver_slot_size) {
				to_quiver = current;
			} else {
				int nsplit = z_info->quiver_slot_size / mult;

				assert(nsplit < current->number);
				if (nsplit > 0 && n_stack_split
						<= n_pack_remaining) {
					/*
					 * Split off the portion that goes to
					 * the pack.  Since the stack in the
					 * quiver is earlier in the gear list it
					 * will prefer to remain in the quiver
					 * in future calls to calc_inventory()
					 * and will be the preferred target for
					 * combine_pack().
					 */
					to_quiver = current;
					gear_insert_end(p, object_split(current,
						current->number - nsplit));
					++n_stack_split;
				} else {
					to_quiver = NULL;
				}
			}

			if (to_quiver) {
				p->upkeep->quiver[prefslot] = to_quiver;
				p->upkeep->quiver_cnt += to_quiver->number * mult;

				/* That part of the gear has been dealt with. */
				assigned[j] = true;
			}
		}
	}

	/* Now fill the rest of the slots in order. */
	for (i = 0; i < z_info->quiver_size; ++i) {
		struct object *first = NULL;
		int jfirst = -1;

		/* If the slot is full, move on. */
		if (p->upkeep->quiver[i]) continue;

		/* Find the quiver object that should go there. */
		j = 0;
		current = p->gear;
		while (1) {
			if (!current) break;
			assert(j < n_max);

			/*
			 * Only try to assign if not assigned, ammo, and,
			 * if necessary to split, have room for the split
			 * stacks.
			 */
			if (!assigned[j] && tval_is_ammo(current)
					&& (current->number
					<= z_info->quiver_slot_size
					|| (z_info->quiver_slot_size > 0
					&& n_stack_split
					<= n_pack_remaining))) {
				/* Choose the first in order. */
				if (earlier_object(first, current, false)) {
					first = current;
					jfirst = j;
				}
			}

			current = current->next;
			++j;
		}

		/* Stop looking if there's nothing left in the gear. */
		if (!first) break;

		/* Put the item in the slot, splitting (if needed) to fit. */
		if (first->number > z_info->quiver_slot_size) {
			assert(z_info->quiver_slot_size > 0
				&& n_stack_split <= n_pack_remaining);
			/* As above, split off the portion going to the pack. */
			gear_insert_end(p, object_split(first,
				first->number - z_info->quiver_slot_size));
		}
		p->upkeep->quiver[i] = first;
		p->upkeep->quiver_cnt += first->number;

		/* That part of the gear has been dealt with. */
		assigned[jfirst] = true;
	}

	/* Note reordering */
	if (character_dungeon) {
		for (i = 0; i < z_info->quiver_size; i++) {
			if (old_quiver[i] && p->upkeep->quiver[i] != old_quiver[i]) {
				msg("You re-arrange your quiver.");
				break;
			}
		}
	}

	/* Copy the current pack */
	for (i = 0; i < z_info->pack_size; i++) {
		old_pack[i] = p->upkeep->inven[i];
	}

	/* Prepare to fill the inventory */
	p->upkeep->inven_cnt = 0;

	for (i = 0; i <= z_info->pack_size; i++) {
		struct object *first = NULL;
		int jfirst = -1;

		/* Find the object that should go there. */
		j = 0;
		current = p->gear;
		while (1) {
			if (!current) break;
			assert(j < n_max);

			/* Consider it if it hasn't already been handled. */
			if (!assigned[j]) {
				/* Choose the first in order. */
				if (earlier_object(first, current, false)) {
					first = current;
					jfirst = j;
				}
			}

			current = current->next;
			++j;
		}

		/* Allocate */
		p->upkeep->inven[i] = first;
		if (first) {
			++p->upkeep->inven_cnt;
			assigned[jfirst] = true;
		}
	}

	/* Note reordering */
	if (character_dungeon && p->upkeep->inven_cnt == old_inven_cnt) {
		for (i = 0; i < z_info->pack_size; i++) {
			if (old_pack[i] && p->upkeep->inven[i] != old_pack[i]
					 && !object_is_equipped(p->body, old_pack[i])) {
				msg("You re-arrange your pack.");
				break;
			}
		}
	}

	mem_free(assigned);
	mem_free(old_pack);
	mem_free(old_quiver);
}